

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::velocity_advection_update(NavierStokesBase *this,Real dt)

{
  undefined8 uVar1;
  pointer pSVar2;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  FabArray<amrex::FArrayBox> *this_02;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_03;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int j;
  int iVar19;
  long lVar20;
  long lVar21;
  int j_2;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  int k;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  FArrayBox *pFVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  FArrayBox *pFVar39;
  long lVar40;
  long lVar41;
  void *__s;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  FArrayBox *pFVar47;
  Real RVar48;
  Real RVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  long local_820;
  Box local_7b4;
  long local_798;
  FArrayBox *local_790;
  long local_788;
  long local_780;
  long local_778;
  FabArray<amrex::FArrayBox> *local_770;
  MFIter mfi;
  FArrayBox tforces;
  FArrayBox ScalFAB;
  Array4<double> local_568;
  Array4<double> local_528;
  Array4<double> local_4e8;
  Array4<double> local_4a8;
  Elixir tf_i;
  Array4<double> local_450;
  Elixir scal_i;
  Array4<double> local_3f8;
  Array4<double> local_3b8;
  Array4<double> local_378;
  undefined1 local_338 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_328;
  int local_310;
  MultiFab Vel;
  
  pSVar2 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar2->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar2->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_02 = &this->aofs->super_FabArray<amrex::FArrayBox>;
  this_03.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar2[2].old_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  local_770 = &get_rho_half_time(this)->super_FabArray<amrex::FArrayBox>;
  local_338._0_8_ = (MultiFab *)0x1;
  local_338._8_8_ = (Arena *)0x0;
  vStack_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (&Vel,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,3,0,(MFInfo *)local_338
             ,(this->super_AmrLevel).m_factory._M_t.
              super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_328);
  local_338._0_8_ = this->u_mac;
  local_338._8_8_ = local_338._0_8_ + 0x180;
  vStack_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(local_338._0_8_ + 0x300);
  amrex::EB_average_face_to_cellcenter(&Vel,0,(Array<const_MultiFab_*,_3> *)local_338);
  amrex::FArrayBox::FArrayBox(&tforces);
  amrex::FArrayBox::FArrayBox(&ScalFAB);
  amrex::MFIter::MFIter(&mfi,&local_770->super_FabArrayBase,true);
  dVar52 = -dt;
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_7b4,&mfi);
    piVar12 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar12 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + mfi.currentIndex;
    }
    pFVar34 = Vel.super_FabArray<amrex::FArrayBox>.m_fabs_v.
              super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar12];
    amrex::FArrayBox::resize
              ((FArrayBox *)&ScalFAB.super_BaseFab<double>,&local_7b4,NUM_SCALARS,(Arena *)0x0);
    amrex::BaseFab<double>::elixir<double,_0>(&scal_i,&ScalFAB.super_BaseFab<double>);
    if (getForceVerbose != 0) {
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)local_338,poVar9);
      std::operator<<((ostream *)&vStack_328,"---");
      std::operator<<((ostream *)&vStack_328,'\n');
      std::operator<<((ostream *)&vStack_328,"F - velocity advection update (half time):");
      std::operator<<((ostream *)&vStack_328,'\n');
      amrex::Print::~Print((Print *)local_338);
    }
    pdVar6 = ScalFAB.super_BaseFab<double>.dptr;
    lVar24 = (long)ScalFAB.super_BaseFab<double>.domain.smallend.vect[0];
    lVar37 = (long)ScalFAB.super_BaseFab<double>.domain.smallend.vect[1];
    lVar28 = (long)ScalFAB.super_BaseFab<double>.domain.smallend.vect[2];
    lVar41 = (long)((ScalFAB.super_BaseFab<double>.domain.bigend.vect[0] -
                    ScalFAB.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
    lVar44 = (long)((ScalFAB.super_BaseFab<double>.domain.bigend.vect[1] -
                    ScalFAB.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
    iVar15 = ScalFAB.super_BaseFab<double>.domain.bigend.vect[2] -
             ScalFAB.super_BaseFab<double>.domain.smallend.vect[2];
    local_790 = pFVar34;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)local_338,
               (FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_450,
               (FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
    lVar10 = (long)local_7b4.smallend.vect[1];
    uVar27 = NUM_SCALARS;
    if (NUM_SCALARS < 1) {
      uVar27 = 0;
    }
    local_780 = (long)local_7b4.smallend.vect[2];
    lVar32 = (long)local_7b4.smallend.vect[0];
    lVar37 = (lVar10 * 8 + (local_780 - lVar28) * lVar44 * 8 + lVar37 * -8) * lVar41 + lVar32 * 8 +
             lVar24 * -8 + (long)pdVar6;
    lVar44 = lVar44 * lVar41 * 8;
    lVar28 = (lVar10 - local_450.begin.y) * local_450.jstride * 8 +
             (local_780 - local_450.begin.z) * local_450.kstride * 8 + lVar32 * 8 +
             (long)local_450.begin.x * -8 + (long)local_450.p;
    local_788 = local_450.nstride * 8;
    lVar24 = (lVar10 - vStack_328.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
             local_338._8_8_ * 8 +
             (local_780 - local_310) *
             (long)vStack_328.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start * 8 + lVar32 * 8 +
             (long)(int)vStack_328.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 + local_338._0_8_;
    local_778 = (long)vStack_328.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish * 8;
    for (uVar17 = 0; lVar32 = lVar28, lVar33 = lVar24, lVar38 = local_780, lVar45 = lVar37,
        uVar17 != uVar27; uVar17 = uVar17 + 1) {
      for (; lVar20 = lVar10, lVar22 = lVar32, lVar25 = lVar33, lVar36 = lVar45,
          lVar38 <= local_7b4.bigend.vect[2]; lVar38 = lVar38 + 1) {
        for (; lVar20 <= local_7b4.bigend.vect[1]; lVar20 = lVar20 + 1) {
          if (local_7b4.smallend.vect[0] <= local_7b4.bigend.vect[0]) {
            lVar16 = 0;
            do {
              *(double *)(lVar36 + lVar16 * 8) =
                   (*(double *)(lVar25 + lVar16 * 8) + *(double *)(lVar22 + lVar16 * 8)) * 0.5;
              lVar16 = lVar16 + 1;
            } while ((local_7b4.bigend.vect[0] - local_7b4.smallend.vect[0]) + 1 != (int)lVar16);
          }
          lVar36 = lVar36 + lVar41 * 8;
          lVar22 = lVar22 + local_450.jstride * 8;
          lVar25 = lVar25 + local_338._8_8_ * 8;
        }
        lVar32 = lVar32 + local_450.kstride * 8;
        lVar33 = lVar33 + (long)vStack_328.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start * 8;
        lVar45 = lVar45 + lVar44;
      }
      lVar37 = lVar37 + (iVar15 + 1) * lVar44;
      lVar28 = lVar28 + local_788;
      lVar24 = lVar24 + local_778;
    }
    RVar48 = amrex::StateData::prevTime
                       ((this->super_AmrLevel).state.
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    RVar49 = amrex::StateData::curTime
                       ((this->super_AmrLevel).state.
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    amrex::FArrayBox::resize((FArrayBox *)&tforces.super_BaseFab<double>,&local_7b4,3,(Arena *)0x0);
    amrex::BaseFab<double>::elixir<double,_0>(&tf_i,&tforces.super_BaseFab<double>);
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x2a])
              ((RVar48 + RVar49) * 0.5,this,&tforces.super_BaseFab<double>,&local_7b4,0,3,local_790,
               &ScalFAB,0,&mfi);
    pdVar6 = tforces.super_BaseFab<double>.dptr;
    iVar5 = local_7b4.bigend.vect[1];
    iVar4 = local_7b4.bigend.vect[0];
    iVar3 = local_7b4.smallend.vect[1];
    iVar15 = local_7b4.smallend.vect[0];
    if ((initial_iter != 0) &&
       (*is_diffusive.super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0
       )) {
      lVar24 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[0];
      lVar37 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[1];
      lVar41 = (long)((tforces.super_BaseFab<double>.domain.bigend.vect[0] -
                      tforces.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
      iVar26 = tforces.super_BaseFab<double>.domain.bigend.vect[1] -
               tforces.super_BaseFab<double>.domain.smallend.vect[1];
      iVar30 = tforces.super_BaseFab<double>.domain.bigend.vect[2] -
               tforces.super_BaseFab<double>.domain.smallend.vect[2];
      lVar38 = (long)local_7b4.smallend.vect[0];
      lVar32 = (long)local_7b4.smallend.vect[1];
      lVar33 = (long)local_7b4.smallend.vect[2];
      lVar44 = (long)local_7b4.bigend.vect[2];
      uVar27 = local_7b4.bigend.vect[0] - local_7b4.smallend.vect[0];
      lVar10 = lVar41 * 8;
      iVar13 = local_7b4.smallend.vect[2] - tforces.super_BaseFab<double>.domain.smallend.vect[2];
      local_820 = 0;
      for (lVar28 = 0; lVar45 = lVar33, iVar8 = iVar13, lVar28 != 3; lVar28 = lVar28 + 1) {
        for (; lVar45 <= lVar44; lVar45 = lVar45 + 1) {
          __s = (void *)((long)pdVar6 +
                        ((iVar8 + local_820) * (iVar26 + 1) * lVar41 + lVar38) * 8 +
                        (lVar32 - lVar37) * lVar10 + lVar24 * -8);
          for (iVar19 = iVar3; iVar19 <= iVar5; iVar19 = iVar19 + 1) {
            if (iVar15 <= iVar4) {
              memset(__s,0,(ulong)uVar27 * 8 + 8);
            }
            __s = (void *)((long)__s + lVar10);
          }
          iVar8 = iVar8 + 1;
        }
        local_820 = local_820 + (iVar30 + 1);
      }
    }
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4a8,
               (FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4e8,
               (FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_528,
               (FabArray<amrex::FArrayBox> *)
               this_03.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
    pdVar6 = tforces.super_BaseFab<double>.dptr;
    lVar28 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[0];
    lVar44 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[1];
    lVar41 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[2];
    lVar10 = (long)((tforces.super_BaseFab<double>.domain.bigend.vect[0] -
                    tforces.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
    lVar24 = (long)((tforces.super_BaseFab<double>.domain.bigend.vect[1] -
                    tforces.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
    local_798 = (long)((tforces.super_BaseFab<double>.domain.bigend.vect[2] -
                       tforces.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_568,this_02,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_378,
               (FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_3b8,
               (FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_3f8,local_770,&mfi);
    iVar15 = do_mom_diff;
    lVar32 = (long)local_7b4.smallend.vect[1];
    lVar38 = (long)local_7b4.smallend.vect[2];
    lVar37 = (long)local_7b4.smallend.vect[0];
    lVar45 = (lVar32 * 8 + (lVar38 - lVar41) * lVar24 * 8 + lVar44 * -8) * lVar10 + lVar37 * 8 +
             lVar28 * -8 + (long)pdVar6;
    lVar44 = (lVar32 - local_4e8.begin.y) * local_4e8.jstride * 8 +
             (lVar38 - local_4e8.begin.z) * local_4e8.kstride * 8 + lVar37 * 8 +
             (long)local_4e8.begin.x * -8 + (long)local_4e8.p;
    pFVar34 = (FArrayBox *)
              ((lVar32 - local_528.begin.y) * local_528.jstride * 8 +
               (lVar38 - local_528.begin.z) * local_528.kstride * 8 + lVar37 * 8 +
               (long)local_528.begin.x * -8 + (long)local_528.p);
    lVar41 = lVar24 * lVar10 * 8;
    local_798 = local_798 * lVar41;
    lVar33 = (lVar32 - local_568.begin.y) * local_568.jstride * 8 +
             (lVar38 - local_568.begin.z) * local_568.kstride * 8 + lVar37 * 8 +
             (long)local_568.begin.x * -8 + (long)local_568.p;
    lVar28 = (lVar32 - local_4a8.begin.y) * local_4a8.jstride * 8 +
             (lVar38 - local_4a8.begin.z) * local_4a8.kstride * 8 + lVar37 * 8 +
             (long)local_4a8.begin.x * -8 + (long)local_4a8.p;
    for (lVar24 = 0; lVar20 = lVar33,
        lVar22 = (lVar32 - local_378.begin.y) * local_378.jstride * 8 +
                 (lVar38 - local_378.begin.z) * local_378.kstride * 8 + lVar37 * 8 +
                 (long)local_378.begin.x * -8 + (long)local_378.p, lVar25 = lVar28,
        lVar36 = (lVar32 - local_3b8.begin.y) * local_3b8.jstride * 8 +
                 (lVar38 - local_3b8.begin.z) * local_3b8.kstride * 8 + lVar37 * 8 +
                 (long)local_3b8.begin.x * -8 + (long)local_3b8.p, lVar16 = lVar44, lVar29 = lVar38,
        pFVar39 = pFVar34,
        lVar42 = (lVar32 - local_3f8.begin.y) * local_3f8.jstride * 8 +
                 (lVar38 - local_3f8.begin.z) * local_3f8.kstride * 8 + lVar37 * 8 +
                 (long)local_3f8.begin.x * -8 + (long)local_3f8.p, lVar46 = lVar45, lVar24 != 3;
        lVar24 = lVar24 + 1) {
      for (; lVar11 = lVar20, lVar14 = lVar22, lVar18 = lVar46, lVar21 = lVar36, lVar23 = lVar32,
          lVar31 = lVar42, lVar35 = lVar25, lVar40 = lVar16, pFVar47 = pFVar39,
          lVar29 <= local_7b4.bigend.vect[2]; lVar29 = lVar29 + 1) {
        for (; lVar23 <= local_7b4.bigend.vect[1]; lVar23 = lVar23 + 1) {
          if (local_7b4.smallend.vect[0] <= local_7b4.bigend.vect[0]) {
            lVar43 = 0;
            do {
              dVar53 = *(double *)(lVar35 + lVar43 * 8);
              if (iVar15 == 0) {
                auVar50._0_8_ = *(double *)(lVar18 + lVar43 * 8) * dt;
                auVar50._8_8_ =
                     *(double *)
                      ((long)(&(pFVar47->super_BaseFab<double>).domain.smallend + -2) + lVar43 * 8)
                     * dt;
                uVar1 = *(undefined8 *)(lVar31 + lVar43 * 8);
                auVar51._8_8_ = uVar1;
                auVar51._0_8_ = uVar1;
                auVar51 = divpd(auVar50,auVar51);
                dVar53 = (*(double *)(lVar11 + lVar43 * 8) * dVar52 + dVar53 + auVar51._0_8_) -
                         auVar51._8_8_;
              }
              else {
                dVar53 = *(double *)
                          ((long)(&(pFVar47->super_BaseFab<double>).domain.smallend + -2) +
                          lVar43 * 8) * dVar52 +
                         *(double *)(lVar18 + lVar43 * 8) * dt +
                         *(double *)(lVar11 + lVar43 * 8) * dVar52 +
                         dVar53 * *(double *)(lVar14 + lVar43 * 8);
                *(double *)(lVar40 + lVar43 * 8) = dVar53;
                dVar53 = dVar53 / *(double *)(lVar21 + lVar43 * 8);
              }
              *(double *)(lVar40 + lVar43 * 8) = dVar53;
              lVar43 = lVar43 + 1;
            } while ((local_7b4.bigend.vect[0] - local_7b4.smallend.vect[0]) + 1 != (int)lVar43);
          }
          lVar40 = lVar40 + local_4e8.jstride * 8;
          pFVar47 = (FArrayBox *)
                    ((long)(&(pFVar47->super_BaseFab<double>).domain.smallend + -2) +
                    local_528.jstride * 8);
          lVar31 = lVar31 + local_3f8.jstride * 8;
          lVar18 = lVar18 + lVar10 * 8;
          lVar11 = lVar11 + local_568.jstride * 8;
          lVar21 = lVar21 + local_3b8.jstride * 8;
          lVar14 = lVar14 + local_378.jstride * 8;
          lVar35 = lVar35 + local_4a8.jstride * 8;
        }
        lVar20 = lVar20 + local_568.kstride * 8;
        lVar22 = lVar22 + local_378.kstride * 8;
        lVar25 = lVar25 + local_4a8.kstride * 8;
        lVar36 = lVar36 + local_3b8.kstride * 8;
        lVar16 = lVar16 + local_4e8.kstride * 8;
        pFVar39 = (FArrayBox *)
                  ((long)(&(pFVar39->super_BaseFab<double>).domain.smallend + -2) +
                  local_528.kstride * 8);
        lVar42 = lVar42 + local_3f8.kstride * 8;
        lVar46 = lVar46 + lVar41;
      }
      lVar44 = lVar44 + local_4e8.nstride * 8;
      pFVar34 = (FArrayBox *)
                ((long)(&(pFVar34->super_BaseFab<double>).domain.smallend + -2) +
                local_528.nstride * 8);
      lVar45 = lVar45 + local_798;
      lVar33 = lVar33 + local_568.nstride * 8;
      lVar28 = lVar28 + local_4a8.nstride * 8;
      local_790 = pFVar39;
      local_788 = lVar42;
      local_780 = lVar46;
      local_778 = lVar20;
    }
    amrex::Gpu::Elixir::~Elixir(&tf_i);
    amrex::Gpu::Elixir::~Elixir(&scal_i);
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::BaseFab<double>::~BaseFab(&ScalFAB.super_BaseFab<double>);
  amrex::BaseFab<double>::~BaseFab(&tforces.super_BaseFab<double>);
  for (iVar15 = 0; iVar15 != 3; iVar15 = iVar15 + 1) {
    bVar7 = amrex::MultiFab::contains_nan
                      ((MultiFab *)
                       this_01.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,iVar15,1,0,
                       false);
    if (bVar7) {
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)local_338,poVar9);
      std::operator<<((ostream *)&vStack_328,"VAU: Old velocity ");
      std::ostream::operator<<((ostream *)&vStack_328,iVar15);
      std::operator<<((ostream *)&vStack_328," contains Nans");
      std::endl<char,std::char_traits<char>>((ostream *)&vStack_328);
      amrex::Print::~Print((Print *)local_338);
      ScalFAB.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x64ffffff9c;
      ScalFAB.super_BaseFab<double>.super_DataAllocator.m_arena._0_4_ = 0xffffff9c;
      amrex::MFIter::MFIter
                (&mfi,(FabArrayBase *)
                      this_01.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,'\0');
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::tilebox((Box *)&tforces.super_BaseFab<double>,&mfi);
        piVar12 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar12 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        bVar7 = amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
                          (*(FArrayBox **)
                            (*(long *)&(((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                          *)((long)this_01.
                                                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                                  _M_head_impl + 0x108))->
                                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                       )._M_impl + (long)*piVar12 * 8),
                           (Box *)&tforces.super_BaseFab<double>,iVar15,1,
                           (IntVect *)&ScalFAB.super_BaseFab<double>);
        if (bVar7) {
          poVar9 = amrex::OutStream();
          amrex::Print::Print((Print *)local_338,poVar9);
          std::operator<<((ostream *)&vStack_328," Nans at ");
          amrex::operator<<((ostream *)&vStack_328,(IntVect *)&ScalFAB.super_BaseFab<double>);
          std::endl<char,std::char_traits<char>>((ostream *)&vStack_328);
          amrex::Print::~Print((Print *)local_338);
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
    }
    bVar7 = amrex::MultiFab::contains_nan
                      ((MultiFab *)
                       this_00.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,iVar15,1,0,
                       false);
    if (bVar7) {
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)local_338,poVar9);
      std::operator<<((ostream *)&vStack_328,"VAU: New velocity ");
      std::ostream::operator<<((ostream *)&vStack_328,iVar15);
      std::operator<<((ostream *)&vStack_328," contains Nans");
      std::endl<char,std::char_traits<char>>((ostream *)&vStack_328);
      amrex::Print::~Print((Print *)local_338);
      ScalFAB.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x64ffffff9c;
      ScalFAB.super_BaseFab<double>.super_DataAllocator.m_arena._0_4_ = 0xffffff9c;
      amrex::MFIter::MFIter
                (&mfi,(FabArrayBase *)
                      this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,'\0');
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::tilebox((Box *)&tforces.super_BaseFab<double>,&mfi);
        piVar12 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar12 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        bVar7 = amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
                          (*(FArrayBox **)
                            (*(long *)&(((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                          *)((long)this_00.
                                                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                                  _M_head_impl + 0x108))->
                                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                       )._M_impl + (long)*piVar12 * 8),
                           (Box *)&tforces.super_BaseFab<double>,iVar15,1,
                           (IntVect *)&ScalFAB.super_BaseFab<double>);
        if (bVar7) {
          poVar9 = amrex::OutStream();
          amrex::Print::Print((Print *)local_338,poVar9);
          std::operator<<((ostream *)&vStack_328," Nans at ");
          amrex::operator<<((ostream *)&vStack_328,(IntVect *)&ScalFAB.super_BaseFab<double>);
          std::endl<char,std::char_traits<char>>((ostream *)&vStack_328);
          amrex::Print::~Print((Print *)local_338);
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
    }
  }
  amrex::MultiFab::~MultiFab(&Vel);
  return;
}

Assistant:

void
NavierStokesBase::velocity_advection_update (Real dt)
{
    BL_PROFILE("NavierStokesBase::velocity_advection_update()");

    MultiFab&  U_old          = get_old_data(State_Type);
    MultiFab&  U_new          = get_new_data(State_Type);
    MultiFab&  Aofs           = *aofs;
    MultiFab&  Gp    = get_old_data(Gradp_Type);
    MultiFab& Rh = get_rho_half_time();

    MultiFab Vel(grids, dmap, AMREX_SPACEDIM, 0, MFInfo(), Factory());
    //
    // Average mac face velocity to cell-centers for use in generating external
    // forcing term in getForce()
    // NOTE that default getForce() does not use Vel or Scal, user must supply the
    // forcing function for that case.
    //
#ifdef AMREX_USE_EB
    // FIXME - this isn't quite right because it's face-centers to cell-centers
    // what's really wanted is face-centroid to cell-centroid
    EB_average_face_to_cellcenter(Vel, 0, Array<MultiFab const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&u_mac[0],&u_mac[1],&u_mac[2])}});
#else
    average_face_to_cellcenter(Vel, 0, Array<MultiFab const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&u_mac[0],&u_mac[1],&u_mac[2])}});
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
{
    FArrayBox  tforces, ScalFAB;

    for (MFIter mfi(Rh,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        FArrayBox& VelFAB = Vel[mfi];
        ScalFAB.resize(bx,NUM_SCALARS);
        Elixir scal_i = ScalFAB.elixir();

        //
        // Need to do some funky half-time stuff.
        //
        if (getForceVerbose)
           amrex::Print() << "---" << '\n' << "F - velocity advection update (half time):" << '\n';
        //
        // Average the new and old time to get Crank-Nicholson half time approximation.
        // Scalars always get updated before velocity (see NavierStokes::advance), so
        // this is garanteed to be good.
        //
        auto const& scal = ScalFAB.array();
        auto const& scal_o = U_old.array(mfi,Density);
        auto const& scal_n = U_new.array(mfi,Density);
        amrex::ParallelFor(bx, NUM_SCALARS, [scal, scal_o, scal_n]
	AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            scal(i,j,k,n) = 0.5 * ( scal_o(i,j,k,n) + scal_n(i,j,k,n) );
        });

        const Real half_time = 0.5*(state[State_Type].prevTime()+state[State_Type].curTime());
        tforces.resize(bx,AMREX_SPACEDIM);
        Elixir tf_i = tforces.elixir();
        getForce(tforces,bx,Xvel,AMREX_SPACEDIM,half_time,VelFAB,ScalFAB,0,mfi);

        //
        // Do following only at initial iteration--per JBB.
        //
        if (initial_iter && is_diffusive[Xvel]) {
           auto const& force  = tforces.array();
           amrex::ParallelFor(bx, AMREX_SPACEDIM, [force]
	   AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
           {
	       force(i,j,k,n) = 0.0;
           });
        }

        // Update velocity
        auto const& vel_old  = U_old.array(mfi);
        auto const& vel_new  = U_new.array(mfi);
        auto const& gradp    = Gp.array(mfi);
        auto const& force    = tforces.array();
        auto const& advec    = Aofs.array(mfi);
        auto const& rho_old  = U_old.array(mfi, Density);
        auto const& rho_new  = U_new.array(mfi, Density);
        auto const& rho_Half = Rh.array(mfi);
        int mom_diff = do_mom_diff;
        amrex::ParallelFor(bx, AMREX_SPACEDIM, [vel_old,vel_new,gradp,force,advec,rho_old,rho_new,rho_Half,mom_diff,dt]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real velold = vel_old(i,j,k,n);

            if ( mom_diff ) {
               velold *= rho_old(i,j,k);
	       vel_new(i,j,k,n) = velold - dt * advec(i,j,k,n)
		                         + dt * force(i,j,k,n)
		                         - dt * gradp(i,j,k,n);

	       vel_new(i,j,k,n) /= rho_new(i,j,k);
            }
	    else
	    {
	        vel_new(i,j,k,n) = velold - dt * advec(i,j,k,n)
                                          + dt * force(i,j,k,n) / rho_Half(i,j,k)
                                          - dt * gradp(i,j,k,n) / rho_Half(i,j,k);
            }
        });
    }
}

    for (int sigma = 0; sigma < AMREX_SPACEDIM; sigma++)
    {
       if (U_old.contains_nan(sigma,1,0))
       {
	 amrex::Print() << "VAU: Old velocity " << sigma << " contains Nans" << std::endl;

	 IntVect mpt(D_DECL(-100,100,-100));
	 for (MFIter mfi(U_old); mfi.isValid(); ++mfi){
	   const Box& bx = mfi.tilebox();
	   if ( U_old[mfi].contains_nan<RunOn::Host>(bx, sigma, 1, mpt) )
	     amrex::Print() << " Nans at " << mpt << std::endl;
	 }
       }
       if (U_new.contains_nan(sigma,1,0))
       {
	 amrex::Print() << "VAU: New velocity " << sigma << " contains Nans" << std::endl;

	 IntVect mpt(D_DECL(-100,100,-100));
	 for (MFIter mfi(U_new); mfi.isValid(); ++mfi){
	   const Box& bx = mfi.tilebox();
	   if ( U_new[mfi].contains_nan<RunOn::Host>(bx, sigma, 1, mpt) )
	     amrex::Print() << " Nans at " << mpt << std::endl;
	 }
       }
    }
}